

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

int __thiscall Dice::rollDiceDetermineStart(Dice *this)

{
  DiceOptions DVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int i;
  int numbOfAttacks;
  DiceOptions value;
  Dice *this_local;
  
  local_18 = 0;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    DVar1 = randomDiceOption(this);
    if (DVar1 == Attack) {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

int Dice::rollDiceDetermineStart(){

    DiceOptions value;
    int numbOfAttacks=0;
    for(int i=0; i<8; i++)
    {
        value = randomDiceOption();
        if(value == DiceOptions::Attack)
        {
            numbOfAttacks++;
        }
    }
    return numbOfAttacks;
}